

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.h
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::Descriptor::SetType(Descriptor *this,EntityType *T)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  
  KVar1 = T->m_ui8Domain;
  KVar2 = T->m_ui16Country;
  KVar3 = T->m_ui8Category;
  KVar4 = T->m_ui8SubCategory;
  KVar5 = T->m_ui8Specific;
  KVar6 = T->m_ui8Extra;
  (this->m_Type).m_ui8EntityKind = T->m_ui8EntityKind;
  (this->m_Type).m_ui8Domain = KVar1;
  (this->m_Type).m_ui16Country = KVar2;
  (this->m_Type).m_ui8Category = KVar3;
  (this->m_Type).m_ui8SubCategory = KVar4;
  (this->m_Type).m_ui8Specific = KVar5;
  (this->m_Type).m_ui8Extra = KVar6;
  return;
}

Assistant:

class KDIS_EXPORT EntityType :  public DataTypeBase
{
protected:

    KUINT8 m_ui8EntityKind;

    KUINT8 m_ui8Domain;

    KUINT16 m_ui16Country;

    KUINT8 m_ui8Category;

    KUINT8 m_ui8SubCategory;

    KUINT8 m_ui8Specific;

    KUINT8 m_ui8Extra;

public:

    static const KUINT16 ENTITY_TYPE_SIZE = 8;

    EntityType();

    EntityType( KDIS::DATA_TYPE::ENUMS::EntityKind Kind, KUINT8 Domain, KDIS::DATA_TYPE::ENUMS::Country Country, KUINT8 Categoy,
                KUINT8 SubCategory, KUINT8 Specific, KUINT8 Extra );

    EntityType( KUINT8 Kind, KUINT8 Domain, KUINT16 Country, KUINT8  Categoy,
                KUINT8 SubCategory, KUINT8 Specific, KUINT8 Extra );

    explicit EntityType(KDataStream &stream) noexcept(false);

    ~EntityType() override = default;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityType::SetEntityKind
    //              KDIS::DATA_TYPE::EntityType::GetEntityKind
    // Description: Kind.
    // Parameter:   EntityKind UI
    //************************************
    void SetEntityKind( KDIS::DATA_TYPE::ENUMS::EntityKind UI );
    KDIS::DATA_TYPE::ENUMS::EntityKind GetEntityKind() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityType::SetDomain
    //              KDIS::DATA_TYPE::EntityType::GetDomain
    // Description: Domain.
    // Parameter:   EntityDomain  UI
    //************************************
    void SetDomain( KDIS::DATA_TYPE::ENUMS::EntityDomain UI );
    KDIS::DATA_TYPE::ENUMS::EntityDomain GetDomain() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityType::SetCountry
    //              KDIS::DATA_TYPE::EntityType::GetCountry
    // Description: Country.
    // Parameter:   Country UI
    //************************************
    void SetCountry( KDIS::DATA_TYPE::ENUMS::Country UI );
    KDIS::DATA_TYPE::ENUMS::Country GetCountry() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityType::SetCategory
    //              KDIS::DATA_TYPE::EntityType::GetCategory
    // Description: Category.
    // Parameter:   KUINT8 UI
    //************************************
    void SetCategory( KUINT8 UI );
    KUINT8 GetCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityType::SetSubCategory
    //              KDIS::DATA_TYPE::EntityType::GetSubCategory
    // Description: Sub Category.
    // Parameter:   KUINT8 UI
    //************************************
    void SetSubCategory( KUINT8 UI );
    KUINT8 GetSubCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityType::SetSpecific
    //              KDIS::DATA_TYPE::EntityType::GetSpecific
    // Description: Specific.
    // Parameter:   KUINT8 UI
    //************************************
    void SetSpecific( KUINT8 UI );
    KUINT8 GetSpecific() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityType::SetExtra
    //              KDIS::DATA_TYPE::EntityType::GetExtra
    // Description: Extra.
    // Parameter:   KUINT8  UI
    //************************************
    void SetExtra( KUINT8 UI );
    KUINT8 GetExtra() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityType::ReadFromTokenisedString
    // Description: Create a tokenised string to represent the type, such as csv.
    //              E.G a csv string such as "1, 1, 224, 0, 0, 0, 0"
    //              ReadFromTokenisedString Throws INVALID_DATA if 7 integer values are not found.
    //              Note: Any values less than 0 will be changed to 0.
    // Parameter:   const KString & String
    // Parameter:   KString & Seperator = ","
    //************************************
    void ReadFromTokenisedString(const KString &String, const KString &Seperator = ",") noexcept(false);
    KString CreateTokenisedString( const KString & Seperator = "," ) const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityType::GetAsString
    // Description: Returns a string representation.
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityType::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityType::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;
    void Encode( KDataStream & stream ) const override;

    KBOOL operator == ( const EntityType & Value ) const;
    KBOOL operator != ( const EntityType & Value ) const;
    KBOOL operator  < ( const EntityType & Value ) const;
}